

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_dynamic_histogram<double,_(unsigned_char)'\x02'>::serialize
          (basic_dynamic_histogram<double,_(unsigned_char)__x02_> *this,string *str)

{
  bool bVar1;
  EVP_PKEY_CTX *dst;
  size_type sVar2;
  metric_t *pmVar3;
  EVP_PKEY_CTX *src;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *in_RSI;
  long in_RDI;
  double dVar4;
  value_type counter;
  size_t i;
  double count;
  atomic<double> *value;
  key_type *labels_value;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
  *e;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  *__range3;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  bucket_counts;
  string value_str;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  value_map;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *in_stack_fffffffffffffe48;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *in_stack_fffffffffffffe60;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *in_stack_fffffffffffffe68;
  metric_t *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  metric_t *in_stack_fffffffffffffe80;
  ulong local_b8;
  __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
  local_88;
  undefined1 *local_80;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  local_78 [3];
  undefined4 local_2c;
  basic_dynamic_histogram<double,_(unsigned_char)__x02_> *local_10;
  
  local_10 = in_RSI;
  dst = (EVP_PKEY_CTX *)
        std::
        __shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x261010);
  dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::copy
            ((dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_> *)
             &stack0xffffffffffffffd8,dst,src);
  bVar1 = std::
          vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
          ::empty((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                   *)in_stack_fffffffffffffe60);
  if (bVar1) {
    local_2c = 1;
  }
  else {
    metric_t::serialize_head(in_stack_fffffffffffffe70,(string *)in_stack_fffffffffffffe68);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe60);
    get_bucket_counts(in_stack_fffffffffffffe48);
    local_80 = &stack0xffffffffffffffd8;
    local_88._M_current =
         (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
          *)std::
            vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
            ::begin((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                     *)in_stack_fffffffffffffe48);
    std::
    vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
    ::end((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
           *)in_stack_fffffffffffffe48);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                             ((__normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                               *)in_stack_fffffffffffffe50,
                              (__normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>_>
                               *)in_stack_fffffffffffffe48), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>_>
      ::operator*(&local_88);
      std::
      __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2610f4);
      std::
      __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x261109);
      dVar4 = std::__atomic_float::operator_cast_to_double((__atomic_float<double> *)0x261122);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        for (local_b8 = 0;
            sVar2 = std::
                    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
                    ::size(local_78), local_b8 < sVar2; local_b8 = local_b8 + 1) {
          std::
          vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
          ::operator[](local_78,local_b8);
          std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>::
          shared_ptr((shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>
                      *)in_stack_fffffffffffffe50,
                     (shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>
                      *)in_stack_fffffffffffffe48);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
          bVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe60);
          if (!bVar1) {
            metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                      (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe70,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                        *)in_stack_fffffffffffffe68);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
          }
          sVar2 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb8));
          if (local_b8 == sVar2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
          }
          else {
            in_stack_fffffffffffffe80 =
                 (metric_t *)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb8),local_b8);
            std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
            in_stack_fffffffffffffe78 =
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe50);
          }
          std::
          __shared_ptr_access<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x261390);
          in_stack_fffffffffffffe70 =
               (metric_t *)
               basic_dynamic_counter<double,_(unsigned_char)'\x02'>::value
                         ((basic_dynamic_counter<double,_(unsigned_char)__x02_> *)
                          in_stack_fffffffffffffe78,(label_key_type)in_stack_fffffffffffffe70);
          std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe50);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
          std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>::
          ~shared_ptr((shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>
                       *)0x261423);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe68 = local_10;
        pmVar3 = (metric_t *)
                 std::
                 __shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2614d2);
        metric_t::labels_name_abi_cxx11_(pmVar3);
        metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe70,
                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)in_stack_fffffffffffffe68);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe60 = local_10;
        std::__atomic_float::operator_cast_to_double((__atomic_float<double> *)0x261526);
        std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe58 =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe50 = local_10;
        pmVar3 = (metric_t *)
                 std::
                 __shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2615ba);
        metric_t::labels_name_abi_cxx11_(pmVar3);
        metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe70,
                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)in_stack_fffffffffffffe68);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe48 = local_10;
        std::__cxx11::to_string((double)in_stack_fffffffffffffe58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_*,_std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>_>
      ::operator++(&local_88);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2616c2
                      );
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2616d5);
    }
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
    ::~vector((vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
               *)in_stack_fffffffffffffe60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    local_2c = 0;
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector((vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
             *)in_stack_fffffffffffffe60);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value_map = sum_->copy();
    if (value_map.empty()) {
      return;
    }

    serialize_head(str);

    std::string value_str;
    auto bucket_counts = get_bucket_counts();
    for (auto &e : value_map) {
      auto &labels_value = e->label;
      auto &value = e->value;
      if (value == 0) {
        continue;
      }

      value_type count = 0;
      for (size_t i = 0; i < bucket_counts.size(); i++) {
        auto counter = bucket_counts[i];
        value_str.append(name_).append("_bucket{");
        if (!labels_name_.empty()) {
          build_label_string(value_str, labels_name_, labels_value);
          value_str.append(",");
        }

        if (i == bucket_boundaries_.size()) {
          value_str.append("le=\"").append("+Inf").append("\"} ");
        }
        else {
          value_str.append("le=\"")
              .append(std::to_string(bucket_boundaries_[i]))
              .append("\"} ");
        }

        count += counter->value(labels_value);
        value_str.append(std::to_string(count));
        value_str.append("\n");
      }

      str.append(value_str);

      str.append(name_);
      str.append("_sum{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");

      str.append(std::to_string(value));
      str.append("\n");

      str.append(name_).append("_count{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");
      str.append(std::to_string(count));
      str.append("\n");
    }
    if (value_str.empty()) {
      str.clear();
    }
  }